

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

fy_eventp * fy_parse_node(fy_parser *fyp,fy_token *fyt,_Bool is_block)

{
  fy_token_type fVar1;
  fy_document_state *fyds;
  list_head *plVar2;
  list_head *plVar3;
  fy_input *pfVar4;
  fy_parser_state fVar5;
  fy_eventp *fyep;
  fy_token *pfVar6;
  int line;
  long lVar7;
  void *pvVar8;
  char *fmt;
  char *pcVar9;
  fy_token *fyt_00;
  ulong handle_size;
  fy_token *local_80;
  fy_atom atom;
  
  fyds = fyp->current_document_state;
  if (fyds == (fy_document_state *)0x0) {
    __assert_fail("fyds",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                  ,0xf30,
                  "struct fy_eventp *fy_parse_node(struct fy_parser *, struct fy_token *, _Bool)");
  }
  pcVar9 = "false";
  if (is_block) {
    pcVar9 = "true";
  }
  fy_parser_diag(fyp,0x30,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,0xf34,"fy_parse_node","parse_node: is_block=%s - fyt %s",pcVar9,
                 fy_token_type_txt[fyt->type]);
  if (fyt->type == FYTT_ALIAS) {
    fVar5 = fy_parse_state_pop(fyp);
    fy_parser_diag(fyp,0x30,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xf1c,"fy_parse_state_set","state %s -> %s\n",state_txt[fyp->state],
                   state_txt[fVar5]);
    fyp->state = fVar5;
    fyep = fy_parse_eventp_alloc(fyp);
    if (fyep != (fy_eventp *)0x0) {
      (fyep->e).type = FYET_ALIAS;
      if (fyt == (fy_token *)0x0 || fyp == (fy_parser *)0x0) {
        fyt = (fy_token *)0x0;
      }
      else {
        plVar2 = (fyt->node).next;
        plVar3 = (fyt->node).prev;
        plVar2->prev = plVar3;
        plVar3->next = plVar2;
        (fyt->node).next = (list_head *)0x0;
        (fyt->node).prev = (list_head *)0x0;
        (fyt->node).next = &fyt->node;
        (fyt->node).prev = &fyt->node;
      }
      (fyep->e).field_1.document_start.document_start = fyt;
LAB_00139701:
      fy_parser_diag(fyp,0x30,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0xff0,"fy_parse_node","parse_node: > %s",fy_event_type_txt[(fyep->e).type]);
      return fyep;
    }
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xf3b,"fy_parse_node","fy_eventp_alloc() failed!");
LAB_001396f2:
    local_80 = (fy_token *)0x0;
    fyt_00 = (fy_token *)0x0;
    fyep = (fy_eventp *)0x0;
  }
  else {
    local_80 = (fy_token *)0x0;
    fyt_00 = (fy_token *)0x0;
    do {
      if ((local_80 != (fy_token *)0x0) || (fyt->type != FYTT_ANCHOR)) {
        if (fyt_00 == (fy_token *)0x0) {
          if (fyt->type != FYTT_TAG) goto LAB_00139824;
          goto LAB_001395b0;
        }
        handle_size = (ulong)(fyt_00->field_9).tag_directive.uri_length;
        if (handle_size == 0) goto LAB_00139824;
        pfVar4 = (fyt_00->handle).fyi;
        lVar7 = 0x48;
        switch((pfVar4->cfg).type) {
        case fyit_file:
          pvVar8 = (pfVar4->field_11).file.addr;
          if (pvVar8 == (void *)0x0) goto switchD_001397cd_caseD_1;
          break;
        case fyit_memory:
        case fyit_alloc:
          lVar7 = 0x28;
        case fyit_stream:
switchD_001397cd_caseD_1:
          pvVar8 = *(void **)((long)&(pfVar4->node).next + lVar7);
          break;
        default:
          pvVar8 = (void *)0x0;
        }
        if (pvVar8 == (void *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.h"
                        ,0x9a,"const void *fy_input_start(const struct fy_input *)");
        }
        pcVar9 = (char *)((long)pvVar8 +
                         (ulong)(fyt_00->field_9).tag_directive.tag_length +
                         (fyt_00->handle).start_mark.input_pos);
        pfVar6 = fy_document_state_lookup_tag_directive(fyds,pcVar9,handle_size);
        if (pfVar6 == (fy_token *)0x0) {
          atom.start_mark.line = 0;
          atom.start_mark.column = 0;
          atom.end_mark.input_pos = 0;
          atom.end_mark.line = 0;
          atom.end_mark.column = 0;
          atom.storage_hint = 0;
          atom.start_mark.input_pos = 0x300000004;
          atom.start_mark._8_8_ = fy_token_ref(fyt_00);
          fyep = (fy_eventp *)0x0;
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)&atom,"undefined tag prefix \'%.*s\'",handle_size,
                     pcVar9);
          goto LAB_0013976f;
        }
LAB_00139824:
        fVar5 = fyp->state;
        if (((fVar5 < FYPS_FLOW_SEQUENCE_FIRST_ENTRY) &&
            ((0x5080U >> (fVar5 & (FYPS_SINGLE_DOCUMENT_END|FYPS_BLOCK_NODE_OR_INDENTLESS_SEQUENCE))
             & 1) != 0)) && (fyt->type == FYTT_BLOCK_ENTRY)) {
          fyep = fy_parse_eventp_alloc(fyp);
          if (fyep == (fy_eventp *)0x0) {
            pcVar9 = "fy_eventp_alloc() failed!";
            fyep = (fy_eventp *)0x0;
            line = 0xf69;
          }
          else {
            (fyep->e).type = FYET_SEQUENCE_START;
            (fyep->e).field_1.document_start.document_start = local_80;
            (fyep->e).field_1.scalar.tag = fyt_00;
            atom.increment = (fyt->handle).increment;
            atom._52_4_ = *(undefined4 *)&(fyt->handle).field_0x34;
            atom.start_mark.input_pos = (fyt->handle).start_mark.input_pos;
            atom.start_mark.line = (fyt->handle).start_mark.line;
            atom.start_mark.column = (fyt->handle).start_mark.column;
            atom.storage_hint = (fyt->handle).storage_hint;
            atom.fyi._0_4_ = *(undefined4 *)&(fyt->handle).fyi;
            atom.fyi._4_4_ = *(undefined4 *)((long)&(fyt->handle).fyi + 4);
            atom.end_mark.input_pos = (fyt->handle).start_mark.input_pos;
            atom.end_mark.line = (fyt->handle).start_mark.line;
            atom.end_mark.column = (fyt->handle).start_mark.column;
            pfVar6 = fy_token_create(FYTT_BLOCK_SEQUENCE_START);
            (fyep->e).field_1.scalar.value = pfVar6;
            if (pfVar6 != (fy_token *)0x0) {
              fy_parser_diag(fyp,0x30,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0xf1c,"fy_parse_state_set","state %s -> %s\n",state_txt[fyp->state],
                             "INDENTLESS_SEQUENCE_ENTRY");
              fyp->state = FYPS_INDENTLESS_SEQUENCE_ENTRY;
              goto LAB_00139701;
            }
            pcVar9 = "fy_token_create() failed!";
            line = 0xf74;
          }
        }
        else {
          fVar1 = fyt->type;
          if (fVar1 == FYTT_FLOW_SEQUENCE_START) {
            fyep = fy_parse_eventp_alloc(fyp);
            if (fyep != (fy_eventp *)0x0) {
              (fyep->e).type = FYET_SEQUENCE_START;
              (fyep->e).field_1.document_start.document_start = local_80;
              (fyep->e).field_1.scalar.tag = fyt_00;
              if (fyt == (fy_token *)0x0 || fyp == (fy_parser *)0x0) {
                fyt = (fy_token *)0x0;
              }
              else {
                plVar2 = (fyt->node).next;
                plVar3 = (fyt->node).prev;
                plVar2->prev = plVar3;
                plVar3->next = plVar2;
                (fyt->node).next = (list_head *)0x0;
                (fyt->node).prev = (list_head *)0x0;
                (fyt->node).next = &fyt->node;
                (fyt->node).prev = &fyt->node;
              }
              (fyep->e).field_1.scalar.value = fyt;
              fVar5 = FYPS_FLOW_SEQUENCE_FIRST_ENTRY;
LAB_00139e71:
              fy_parse_state_set(fyp,fVar5);
              goto LAB_00139701;
            }
            pcVar9 = "fy_eventp_alloc() failed!";
            fyep = (fy_eventp *)0x0;
            line = 0xf8d;
          }
          else if (fVar1 == FYTT_FLOW_MAPPING_START) {
            fyep = fy_parse_eventp_alloc(fyp);
            if (fyep != (fy_eventp *)0x0) {
              (fyep->e).type = FYET_MAPPING_START;
              (fyep->e).field_1.document_start.document_start = local_80;
              (fyep->e).field_1.scalar.tag = fyt_00;
              if (fyt == (fy_token *)0x0 || fyp == (fy_parser *)0x0) {
                fyt = (fy_token *)0x0;
              }
              else {
                plVar2 = (fyt->node).next;
                plVar3 = (fyt->node).prev;
                plVar2->prev = plVar3;
                plVar3->next = plVar2;
                (fyt->node).next = (list_head *)0x0;
                (fyt->node).prev = (list_head *)0x0;
                (fyt->node).next = &fyt->node;
                (fyt->node).prev = &fyt->node;
              }
              (fyep->e).field_1.scalar.value = fyt;
              fVar5 = FYPS_FLOW_MAPPING_FIRST_KEY;
              goto LAB_00139e71;
            }
            pcVar9 = "fy_eventp_alloc() failed!";
            fyep = (fy_eventp *)0x0;
            line = 0xf9c;
          }
          else {
            if (fVar1 == FYTT_SCALAR) {
              fVar5 = fy_parse_state_pop(fyp);
              fy_parser_diag(fyp,0x30,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0xf1c,"fy_parse_state_set","state %s -> %s\n",state_txt[fyp->state],
                             state_txt[fVar5]);
              fyp->state = fVar5;
              fyep = fy_parse_eventp_alloc(fyp);
              if (fyep == (fy_eventp *)0x0) {
                fyep = (fy_eventp *)0x0;
                fy_parser_diag(fyp,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                               ,0xf7f,"fy_parse_node","fy_eventp_alloc() failed!");
                goto LAB_0013976f;
              }
              (fyep->e).type = FYET_SCALAR;
              (fyep->e).field_1.document_start.document_start = local_80;
              (fyep->e).field_1.scalar.tag = fyt_00;
              if (fyt == (fy_token *)0x0 || fyp == (fy_parser *)0x0) {
                fyt = (fy_token *)0x0;
              }
              else {
                plVar2 = (fyt->node).next;
                plVar3 = (fyt->node).prev;
                plVar2->prev = plVar3;
                plVar3->next = plVar2;
                (fyt->node).next = (list_head *)0x0;
                (fyt->node).prev = (list_head *)0x0;
                (fyt->node).next = &fyt->node;
                (fyt->node).prev = &fyt->node;
              }
              (fyep->e).field_1.scalar.value = fyt;
              goto LAB_00139701;
            }
            if (fVar1 != FYTT_BLOCK_SEQUENCE_START || !is_block) {
              if (fVar1 != FYTT_BLOCK_MAPPING_START || !is_block) {
                if (local_80 == (fy_token *)0x0 && fyt_00 == (fy_token *)0x0) {
                  if (fVar5 - FYPS_FLOW_SEQUENCE_FIRST_ENTRY < 2 && fVar1 == FYTT_FLOW_ENTRY) {
                    atom.start_mark.line = 0;
                    atom.start_mark.column = 0;
                    atom.end_mark.input_pos = 0;
                    atom.end_mark.line = 0;
                    atom.end_mark.column = 0;
                    atom.storage_hint = 0;
                    atom.start_mark.input_pos = 0x300000004;
                    atom.start_mark._8_8_ = fy_token_ref(fyt);
                    pcVar9 = "extra comma";
                    if (fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY) {
                      pcVar9 = "comma in the beginning";
                    }
                    fmt = "flow sequence with invalid %s";
                  }
                  else {
                    if (1 < (fVar1 - FYTT_DOCUMENT_START | fVar5 - FYPS_FLOW_SEQUENCE_FIRST_ENTRY))
                    {
                      atom.start_mark.line = 0;
                      atom.start_mark.column = 0;
                      atom.end_mark.input_pos = 0;
                      atom.end_mark.line = 0;
                      atom.end_mark.column = 0;
                      atom.storage_hint = 0;
                      atom.start_mark.input_pos = 0x300000004;
                      atom.start_mark._8_8_ = fy_token_ref(fyt);
                      fy_parser_diag_report
                                (fyp,(fy_diag_report_ctx *)&atom,
                                 "did not find expected node content");
                      goto LAB_001396f2;
                    }
                    atom.start_mark.line = 0;
                    atom.start_mark.column = 0;
                    atom.end_mark.input_pos = 0;
                    atom.end_mark.line = 0;
                    atom.end_mark.column = 0;
                    atom.storage_hint = 0;
                    atom.start_mark.input_pos = 0x300000004;
                    atom.start_mark._8_8_ = fy_token_ref(fyt);
                    pcVar9 = "end";
                    if (fyt->type == FYTT_DOCUMENT_START) {
                      pcVar9 = "start";
                    }
                    fmt = "invalid document %s indicator in a flow sequence";
                  }
                  fy_parser_diag_report(fyp,(fy_diag_report_ctx *)&atom,fmt,pcVar9);
                  goto LAB_001396f2;
                }
                fy_parser_diag(fyp,0x30,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                               ,0xfdf,"fy_parse_node","parse_node: empty scalar...");
                fVar5 = fy_parse_state_pop(fyp);
                fy_parse_state_set(fyp,fVar5);
                fyep = fy_parse_eventp_alloc(fyp);
                if (fyep != (fy_eventp *)0x0) {
                  (fyep->e).type = FYET_SCALAR;
                  (fyep->e).field_1.document_start.document_start = local_80;
                  (fyep->e).field_1.scalar.tag = fyt_00;
                  (fyep->e).field_1.scalar.value = (fy_token *)0x0;
                  goto LAB_00139701;
                }
                pcVar9 = "fy_eventp_alloc() failed!";
                fyep = (fy_eventp *)0x0;
                line = 0xfe6;
              }
              else {
                fyep = fy_parse_eventp_alloc(fyp);
                if (fyep != (fy_eventp *)0x0) {
                  (fyep->e).type = FYET_MAPPING_START;
                  (fyep->e).field_1.document_start.document_start = local_80;
                  (fyep->e).field_1.scalar.tag = fyt_00;
                  if (fyt == (fy_token *)0x0 || fyp == (fy_parser *)0x0) {
                    fyt = (fy_token *)0x0;
                  }
                  else {
                    plVar2 = (fyt->node).next;
                    plVar3 = (fyt->node).prev;
                    plVar2->prev = plVar3;
                    plVar3->next = plVar2;
                    (fyt->node).next = (list_head *)0x0;
                    (fyt->node).prev = (list_head *)0x0;
                    (fyt->node).next = &fyt->node;
                    (fyt->node).prev = &fyt->node;
                  }
                  (fyep->e).field_1.scalar.value = fyt;
                  fVar5 = FYPS_BLOCK_MAPPING_FIRST_KEY;
                  goto LAB_00139e71;
                }
                pcVar9 = "fy_eventp_alloc() failed!";
                fyep = (fy_eventp *)0x0;
                line = 0xfba;
              }
            }
            else {
              fyep = fy_parse_eventp_alloc(fyp);
              if (fyep != (fy_eventp *)0x0) {
                (fyep->e).type = FYET_SEQUENCE_START;
                (fyep->e).field_1.document_start.document_start = local_80;
                (fyep->e).field_1.scalar.tag = fyt_00;
                if (fyt == (fy_token *)0x0 || fyp == (fy_parser *)0x0) {
                  fyt = (fy_token *)0x0;
                }
                else {
                  plVar2 = (fyt->node).next;
                  plVar3 = (fyt->node).prev;
                  plVar2->prev = plVar3;
                  plVar3->next = plVar2;
                  (fyt->node).next = (list_head *)0x0;
                  (fyt->node).prev = (list_head *)0x0;
                  (fyt->node).next = &fyt->node;
                  (fyt->node).prev = &fyt->node;
                }
                (fyep->e).field_1.scalar.value = fyt;
                fVar5 = FYPS_BLOCK_SEQUENCE_FIRST_ENTRY;
                goto LAB_00139e71;
              }
              pcVar9 = "fy_eventp_alloc() failed!";
              fyep = (fy_eventp *)0x0;
              line = 0xfab;
            }
          }
        }
LAB_00139768:
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,line,"fy_parse_node",pcVar9);
        goto LAB_0013976f;
      }
LAB_001395b0:
      if (fyt->type == FYTT_ANCHOR) {
        local_80 = fyt;
        if (fyp == (fy_parser *)0x0 || fyt == (fy_token *)0x0) {
          local_80 = (fy_token *)0x0;
        }
        else {
LAB_001395e0:
          plVar2 = (fyt->node).next;
          plVar3 = (fyt->node).prev;
          plVar2->prev = plVar3;
          plVar3->next = plVar2;
          (fyt->node).next = (list_head *)0x0;
          (fyt->node).prev = (list_head *)0x0;
          (fyt->node).next = &fyt->node;
          (fyt->node).prev = &fyt->node;
        }
      }
      else {
        fyt_00 = fyt;
        if (fyp != (fy_parser *)0x0 && fyt != (fy_token *)0x0) goto LAB_001395e0;
        fyt_00 = (fy_token *)0x0;
      }
      fyt = fy_scan_peek(fyp);
      if (fyt == (fy_token *)0x0) {
        pcVar9 = "failed to peek token";
        fyep = (fy_eventp *)0x0;
        line = 0xf4c;
        goto LAB_00139768;
      }
      fy_parser_diag(fyp,0x30,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0xf4f,"fy_parse_node","parse_node: ANCHOR|TAG got -  fyt %s",
                     fy_token_type_txt[fyt->type]);
    } while (fyt->type != FYTT_ALIAS);
    atom.start_mark.line = 0;
    atom.start_mark.column = 0;
    atom.end_mark.input_pos = 0;
    atom.end_mark.line = 0;
    atom.end_mark.column = 0;
    atom.storage_hint = 0;
    atom.start_mark.input_pos = 0x300000004;
    atom.start_mark._8_8_ = fy_token_ref(fyt);
    fyep = (fy_eventp *)0x0;
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)&atom,"unexpected alias");
  }
LAB_0013976f:
  fy_token_unref(local_80);
  fy_token_unref(fyt_00);
  fy_parse_eventp_recycle(fyp,fyep);
  return (fy_eventp *)0x0;
}

Assistant:

static struct fy_eventp *
fy_parse_node(struct fy_parser *fyp, struct fy_token *fyt, bool is_block) {
    struct fy_eventp *fyep = NULL;
    struct fy_event *fye = NULL;
    struct fy_document_state *fyds = NULL;
    struct fy_token *anchor = NULL, *tag = NULL;
    const char *handle;
    size_t handle_size;
    struct fy_atom atom;
    struct fy_token *fyt_td;

    fyds = fyp->current_document_state;
    assert(fyds);

    fyp_parse_debug(fyp, "parse_node: is_block=%s - fyt %s",
                    is_block ? "true" : "false",
                    fy_token_type_txt[fyt->type]);

    if (fyt->type == FYTT_ALIAS) {
        fy_parse_state_set(fyp, fy_parse_state_pop(fyp));

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_ALIAS;
        fye->alias.anchor = fy_scan_remove(fyp, fyt);

        goto return_ok;
    }

    while ((!anchor && fyt->type == FYTT_ANCHOR) || (!tag && fyt->type == FYTT_TAG)) {
        if (fyt->type == FYTT_ANCHOR)
            anchor = fy_scan_remove(fyp, fyt);
        else
            tag = fy_scan_remove(fyp, fyt);

        fyt = fy_scan_peek(fyp);
        fyp_error_check(fyp, fyt, err_out,
                        "failed to peek token");

        fyp_parse_debug(fyp, "parse_node: ANCHOR|TAG got -  fyt %s",
                        fy_token_type_txt[fyt->type]);

        FYP_TOKEN_ERROR_CHECK(fyp, fyt, FYEM_PARSE,
                              fyt->type != FYTT_ALIAS, err_out,
                              "unexpected alias");
    }

    /* check tag prefix */
    if (tag && tag->tag.handle_length) {
        handle = fy_atom_data(&tag->handle) + tag->tag.skip;
        handle_size = tag->tag.handle_length;

        fyt_td = fy_document_state_lookup_tag_directive(fyds, handle, handle_size);

        FYP_TOKEN_ERROR_CHECK(fyp, tag, FYEM_PARSE,
                              fyt_td, err_out,
                              "undefined tag prefix '%.*s'", (int) handle_size, handle);
    }

    if ((fyp->state == FYPS_BLOCK_NODE_OR_INDENTLESS_SEQUENCE ||
         fyp->state == FYPS_BLOCK_MAPPING_VALUE ||
         fyp->state == FYPS_BLOCK_MAPPING_FIRST_KEY)
        && fyt->type == FYTT_BLOCK_ENTRY) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SEQUENCE_START;
        fye->sequence_start.anchor = anchor;
        fye->sequence_start.tag = tag;

        atom = fyt->handle;
        atom.end_mark = atom.start_mark;    /* no extent */
        fye->sequence_start.sequence_start = fy_token_create(FYTT_BLOCK_SEQUENCE_START, &atom);
        fyp_error_check(fyp, fye->sequence_start.sequence_start, err_out,
                        "fy_token_create() failed!");

        fy_parse_state_set(fyp, FYPS_INDENTLESS_SEQUENCE_ENTRY);
        goto return_ok;
    }

    if (fyt->type == FYTT_SCALAR) {
        fy_parse_state_set(fyp, fy_parse_state_pop(fyp));

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SCALAR;
        fye->scalar.anchor = anchor;
        fye->scalar.tag = tag;
        fye->scalar.value = fy_scan_remove(fyp, fyt);
        goto return_ok;
    }

    if (fyt->type == FYTT_FLOW_SEQUENCE_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SEQUENCE_START;
        fye->sequence_start.anchor = anchor;
        fye->sequence_start.tag = tag;
        fye->sequence_start.sequence_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_FLOW_SEQUENCE_FIRST_ENTRY);
        goto return_ok;
    }

    if (fyt->type == FYTT_FLOW_MAPPING_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_MAPPING_START;
        fye->mapping_start.anchor = anchor;
        fye->mapping_start.tag = tag;
        fye->mapping_start.mapping_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_FLOW_MAPPING_FIRST_KEY);
        goto return_ok;
    }

    if (is_block && fyt->type == FYTT_BLOCK_SEQUENCE_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SEQUENCE_START;
        fye->sequence_start.anchor = anchor;
        fye->sequence_start.tag = tag;
        fye->sequence_start.sequence_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_BLOCK_SEQUENCE_FIRST_ENTRY);
        goto return_ok;
    }

    if (is_block && fyt->type == FYTT_BLOCK_MAPPING_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_MAPPING_START;
        fye->mapping_start.anchor = anchor;
        fye->mapping_start.tag = tag;
        fye->mapping_start.mapping_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_BLOCK_MAPPING_FIRST_KEY);
        goto return_ok;
    }

    if (!anchor && !tag) {

        if (fyt->type == FYTT_FLOW_ENTRY &&
            (fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ||
             fyp->state == FYPS_FLOW_SEQUENCE_ENTRY))

            FYP_TOKEN_ERROR(fyp, fyt, FYEM_PARSE,
                            "flow sequence with invalid %s",
                            fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ?
                            "comma in the beginning" : "extra comma");

        else if ((fyt->type == FYTT_DOCUMENT_START || fyt->type == FYTT_DOCUMENT_END) &&
                 (fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ||
                  fyp->state == FYPS_FLOW_SEQUENCE_ENTRY))

            FYP_TOKEN_ERROR(fyp, fyt, FYEM_PARSE,
                            "invalid document %s indicator in a flow sequence",
                            fyt->type == FYTT_DOCUMENT_START ?
                            "start" : "end");
        else
            FYP_TOKEN_ERROR(fyp, fyt, FYEM_PARSE,
                            "did not find expected node content");

        goto err_out;
    }

    fyp_parse_debug(fyp, "parse_node: empty scalar...");

    /* empty scalar */
    fy_parse_state_set(fyp, fy_parse_state_pop(fyp));

    fyep = fy_parse_eventp_alloc(fyp);
    fyp_error_check(fyp, fyep, err_out,
                    "fy_eventp_alloc() failed!");
    fye = &fyep->e;

    fye->type = FYET_SCALAR;
    fye->scalar.anchor = anchor;
    fye->scalar.tag = tag;
    fye->scalar.value = NULL;

    return_ok:
    fyp_parse_debug(fyp, "parse_node: > %s",
                    fy_event_type_txt[fye->type]);

    return fyep;

    err_out:
    fy_token_unref(anchor);
    fy_token_unref(tag);
    fy_parse_eventp_recycle(fyp, fyep);

    return NULL;
}